

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_certificate_chain.cc
# Opt level: O3

LevelDetails * __thiscall
bssl::anon_unknown_12::ValidPolicyGraph::StartLevel
          (LevelDetails *__return_storage_ptr__,ValidPolicyGraph *this)

{
  _Rb_tree_node_base *__k;
  _Rb_tree_header *p_Var1;
  pointer *ppmVar2;
  pointer pmVar3;
  iterator __position;
  pointer __first;
  _Base_ptr p_Var4;
  vector<bssl::der::Input,std::allocator<bssl::der::Input>> *this_00;
  _Base_ptr p_Var5;
  ulong uVar6;
  pointer __result;
  long lVar7;
  pointer pmVar8;
  LevelDetails *extraout_RAX;
  ulong uVar9;
  _Rb_tree_header *p_Var10;
  ulong uVar11;
  long lVar12;
  _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>,_std::_Select1st<std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>_>_>
  local_68;
  bool local_38;
  
  pmVar3 = (this->levels_).
           super__Vector_base<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->levels_).
      super__Vector_base<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != pmVar3) {
    p_Var5 = pmVar3[-1]._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var10 = &pmVar3[-1]._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var5 != p_Var10) {
      do {
        if (*(char *)&p_Var5[2]._M_parent == '\0') {
          __k = p_Var5 + 1;
          this_00 = (vector<bssl::der::Input,std::allocator<bssl::der::Input>> *)
                    ::std::
                    map<bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>_>_>
                    ::operator[](&(this->current_level_).expected_policy_map,(key_type *)__k);
          __position._M_current = *(Input **)(this_00 + 8);
          if (__position._M_current == *(Input **)(this_00 + 0x10)) {
            ::std::vector<bssl::der::Input,std::allocator<bssl::der::Input>>::
            _M_realloc_insert<bssl::der::Input_const&>(this_00,__position,(Input *)__k);
          }
          else {
            p_Var4 = p_Var5[1]._M_parent;
            ((__position._M_current)->data_).data_ = *(uchar **)__k;
            ((__position._M_current)->data_).size_ = (size_t)p_Var4;
            *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x10;
          }
        }
        p_Var5 = (_Base_ptr)::std::_Rb_tree_increment(p_Var5);
      } while ((_Rb_tree_header *)p_Var5 != p_Var10);
    }
  }
  p_Var10 = &(this->current_level_).expected_policy_map._M_t._M_impl.super__Rb_tree_header;
  ::std::_Rb_tree_header::_Rb_tree_header
            (&(__return_storage_ptr__->expected_policy_map)._M_t._M_impl.super__Rb_tree_header,
             p_Var10);
  __return_storage_ptr__->has_any_policy = (this->current_level_).has_any_policy;
  pmVar8 = (this->levels_).
           super__Vector_base<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pmVar8 == (this->levels_).
                super__Vector_base<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    __first = (this->levels_).
              super__Vector_base<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar12 = (long)pmVar8 - (long)__first;
    if (lVar12 == 0x7fffffffffffffe0) {
      ::std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar9 = (lVar12 >> 4) * -0x5555555555555555;
    uVar6 = 1;
    if (pmVar8 != __first) {
      uVar6 = uVar9;
    }
    uVar11 = uVar6 + uVar9;
    if (0x2aaaaaaaaaaaaa9 < uVar11) {
      uVar11 = 0x2aaaaaaaaaaaaaa;
    }
    if (CARRY8(uVar6,uVar9)) {
      uVar11 = 0x2aaaaaaaaaaaaaa;
    }
    __result = (pointer)operator_new(uVar11 * 0x30);
    lVar7 = (long)__result + lVar12 + 8;
    *(undefined8 *)((long)__result + lVar12) = 0;
    ((undefined8 *)((long)__result + lVar12))[1] = 0;
    *(undefined8 *)((long)__result + lVar12 + 0x10) = 0;
    *(long *)((long)__result + lVar12 + 0x18) = lVar7;
    *(long *)((long)__result + lVar12 + 0x20) = lVar7;
    *(undefined8 *)((long)__result + lVar12 + 0x28) = 0;
    pmVar8 = ::std::
             vector<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
             ::_S_relocate(__first,pmVar8,__result,(_Tp_alloc_type *)0x0);
    if (__first != (pointer)0x0) {
      operator_delete(__first,(long)(this->levels_).
                                    super__Vector_base<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)__first);
    }
    (this->levels_).
    super__Vector_base<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = __result;
    (this->levels_).
    super__Vector_base<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pmVar8 + 1;
    (this->levels_).
    super__Vector_base<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + uVar11;
  }
  else {
    p_Var1 = &(pmVar8->_M_t)._M_impl.super__Rb_tree_header;
    *(undefined8 *)&(pmVar8->_M_t)._M_impl = 0;
    *(undefined8 *)&(pmVar8->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
    (pmVar8->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (pmVar8->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    (pmVar8->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    (pmVar8->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    ppmVar2 = &(this->levels_).
               super__Vector_base<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppmVar2 = *ppmVar2 + 1;
  }
  p_Var1 = &local_68._M_impl.super__Rb_tree_header;
  local_68._M_impl._0_8_ = 0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_38 = false;
  local_68._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  ::std::
  _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>,_std::_Select1st<std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>_>_>
  ::clear((_Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>,_std::_Select1st<std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>_>_>
           *)&this->current_level_);
  if (local_68._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    (this->current_level_).expected_policy_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color
         = local_68._M_impl.super__Rb_tree_header._M_header._M_color;
    (this->current_level_).expected_policy_map._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_parent = local_68._M_impl.super__Rb_tree_header._M_header._M_parent;
    (this->current_level_).expected_policy_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left
         = local_68._M_impl.super__Rb_tree_header._M_header._M_left;
    (this->current_level_).expected_policy_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right
         = local_68._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_68._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var10->_M_header;
    (this->current_level_).expected_policy_map._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_68._M_impl.super__Rb_tree_header._M_node_count;
    local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_68._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_68._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  (this->current_level_).has_any_policy = local_38;
  ::std::
  _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>,_std::_Select1st<std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>_>_>
  ::~_Rb_tree(&local_68);
  return extraout_RAX;
}

Assistant:

LevelDetails StartLevel() {
    // Finish building expected_policy_map for the previous level.
    if (!levels_.empty()) {
      for (const auto &[policy, node] : levels_.back()) {
        if (!node.mapped) {
          current_level_.expected_policy_map[policy].push_back(policy);
        }
      }
    }

    LevelDetails prev_level = std::move(current_level_);
    levels_.emplace_back();
    current_level_ = LevelDetails{};
    return prev_level;
  }